

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Option *opt)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  void *ptr_1;
  Mat cell;
  Mat hidden;
  void *local_1c0;
  void *local_1b8;
  Mat *local_1b0;
  void *local_1a8;
  undefined8 uStack_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  Allocator *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  long lStack_170;
  void *local_168;
  undefined8 uStack_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  Allocator *local_148;
  undefined4 uStack_140;
  uint uStack_13c;
  undefined8 local_138;
  long lStack_130;
  Mat *local_120;
  int local_118;
  int local_114;
  uint local_110;
  int local_10c;
  undefined1 local_108 [16];
  ulong local_f0;
  int *local_e8;
  Allocator *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  size_t local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  size_t local_90;
  void *local_88;
  long local_80;
  void *local_78;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = bias_c;
  local_f0 = (ulong)(uint)bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar2 = top_blob->w;
  uVar19 = (ulong)uVar2;
  lVar4 = (long)(int)uVar2;
  local_148 = opt->workspace_allocator;
  local_168 = (void *)0x0;
  uStack_160._0_4_ = 0;
  uStack_160._4_4_ = 0;
  uStack_160 = (int *)0x0;
  uStack_158 = 4;
  uStack_154 = 0;
  uStack_150 = 1;
  _uStack_140 = CONCAT44(uVar2,1);
  local_138 = 0x100000001;
  local_1b0 = weight_xc;
  lStack_130 = lVar4;
  local_120 = top_blob;
  local_10c = reverse;
  if (uVar2 != 0) {
    if (local_148 == (Allocator *)0x0) {
      local_1a8 = (void *)0x0;
      iVar10 = posix_memalign(&local_1a8,0x10,lVar4 * 4 + 4);
      local_168 = local_1a8;
      if (iVar10 != 0) {
        local_1a8 = (void *)0x0;
        local_168 = local_1a8;
      }
    }
    else {
      local_168 = (void *)(**(code **)(*(long *)local_148 + 0x10))(local_148);
    }
    uStack_160 = (int *)((long)local_168 + lVar4 * 4);
    *(undefined4 *)((long)local_168 + lVar4 * 4) = 1;
  }
  iVar10 = -100;
  if ((local_168 != (void *)0x0) && (local_138._4_4_ * lStack_130 != 0)) {
    local_188 = opt->workspace_allocator;
    local_1a8 = (void *)0x0;
    uStack_1a0._0_4_ = 0;
    uStack_1a0._4_4_ = 0;
    uStack_1a0 = (int *)0x0;
    uStack_198 = 4;
    uStack_194 = 0;
    uStack_190 = 1;
    uStack_180 = CONCAT44(uVar2,1);
    local_178 = 0x100000001;
    lStack_170 = lVar4;
    if (uVar2 != 0) {
      if (local_188 == (Allocator *)0x0) {
        local_1c0 = (void *)0x0;
        iVar10 = posix_memalign(&local_1c0,0x10,lVar4 * 4 + 4);
        local_1a8 = local_1c0;
        if (iVar10 != 0) {
          local_1c0 = (void *)0x0;
          local_1a8 = local_1c0;
        }
      }
      else {
        local_1a8 = (void *)(**(code **)(*(long *)local_188 + 0x10))(local_188);
      }
      uStack_1a0 = (int *)((long)local_1a8 + lVar4 * 4);
      *(undefined4 *)((long)local_1a8 + lVar4 * 4) = 1;
    }
    iVar10 = -100;
    if ((local_1a8 != (void *)0x0) && (local_178._4_4_ * lStack_170 != 0)) {
      local_e0 = opt->workspace_allocator;
      if (uVar2 == 0) {
        piVar21 = (int *)0x0;
        local_1b8 = (void *)0x0;
      }
      else {
        lVar20 = lVar4 * 0x10;
        if (local_e0 == (Allocator *)0x0) {
          local_1c0 = (void *)0x0;
          iVar10 = posix_memalign(&local_1c0,0x10,lVar20 + 4);
          local_1b8 = local_1c0;
          if (iVar10 != 0) {
            local_1c0 = (void *)0x0;
            local_1b8 = local_1c0;
          }
        }
        else {
          local_1b8 = (void *)(**(code **)(*(long *)local_e0 + 0x10))(local_e0);
        }
        piVar21 = (int *)((long)local_1b8 + lVar20);
        *(undefined4 *)((long)local_1b8 + lVar20) = 1;
      }
      iVar10 = -100;
      if (uVar2 != 0 && local_1b8 != (void *)0x0) {
        if (0 < local_138._4_4_ * (int)lStack_130) {
          memset(local_168,0,(ulong)(uint)(local_138._4_4_ * (int)lStack_130) << 2);
        }
        if (0 < local_178._4_4_ * (int)lStack_170) {
          memset(local_1a8,0,(ulong)(uint)(local_178._4_4_ * (int)lStack_170) << 2);
        }
        if ((int)uVar3 < 1) {
          iVar10 = 0;
        }
        else {
          local_88 = bottom_blob->data;
          local_90 = bottom_blob->elemsize;
          local_114 = bottom_blob->w;
          local_40 = *(long *)local_108._0_8_;
          lVar20 = (long)*(int *)(local_108._0_8_ + 0x2c) * *(long *)(local_108._0_8_ + 0x10);
          local_48 = local_40 + lVar20;
          local_50 = local_40 + lVar20 * 2;
          local_58 = lVar20 * 3 + local_40;
          local_98 = local_1b0->data;
          local_a0 = weight_hc->data;
          local_60 = (long)local_1b0->w * local_1b0->elemsize;
          local_a8 = local_120->data;
          local_68 = (long)weight_hc->w * weight_hc->elemsize;
          local_b0 = local_120->elemsize;
          local_118 = local_120->w;
          local_c8 = (void *)(local_60 * (int)(uVar2 * 3) + (long)local_98);
          local_d0 = (void *)(local_60 * (int)(uVar2 * 2) + (long)local_98);
          local_d8 = (void *)(local_60 * lVar4 + (long)local_98);
          local_c0 = (void *)((int)(uVar2 * 3) * local_68 + (long)local_a0);
          local_b8 = (void *)((int)(uVar2 * 2) * local_68 + (long)local_a0);
          pvVar17 = (void *)(lVar4 * local_68 + (long)local_a0);
          local_70 = local_1a8;
          local_78 = local_168;
          local_80 = uVar19 * 4;
          uVar9 = 0;
          uVar8 = local_f0;
          pvVar18 = local_1b8;
          local_110 = uVar3;
          local_e8 = piVar21;
          do {
            uVar3 = ~uVar9 + local_110;
            if (local_10c == 0) {
              uVar3 = uVar9;
            }
            if (0 < (int)uVar2) {
              uVar22 = 0;
              pvVar5 = local_c8;
              pvVar6 = local_a0;
              pvVar11 = pvVar17;
              pvVar12 = local_b8;
              pvVar13 = local_c0;
              pvVar14 = local_98;
              pvVar15 = local_d8;
              pvVar16 = local_d0;
              do {
                fVar26 = *(float *)(local_58 + uVar22 * 4);
                fVar25 = *(float *)(local_50 + uVar22 * 4);
                fVar24 = *(float *)(local_48 + uVar22 * 4);
                fVar23 = *(float *)(local_40 + uVar22 * 4);
                if (0 < (int)uVar8) {
                  uVar7 = 0;
                  do {
                    fVar27 = *(float *)((long)local_88 +
                                       uVar7 * 4 + (long)(int)(local_114 * uVar3) * local_90);
                    fVar23 = fVar23 + fVar27 * *(float *)((long)pvVar14 + uVar7 * 4);
                    fVar24 = fVar24 + fVar27 * *(float *)((long)pvVar15 + uVar7 * 4);
                    fVar25 = fVar25 + fVar27 * *(float *)((long)pvVar16 + uVar7 * 4);
                    fVar26 = fVar26 + fVar27 * *(float *)((long)pvVar5 + uVar7 * 4);
                    uVar7 = uVar7 + 1;
                  } while (uVar8 != uVar7);
                }
                uVar8 = 0;
                do {
                  if (uVar9 == 0) {
                    fVar27 = 0.0;
                  }
                  else {
                    fVar27 = *(float *)((long)local_168 + uVar8 * 4);
                  }
                  fVar23 = fVar23 + fVar27 * *(float *)((long)pvVar6 + uVar8 * 4);
                  fVar24 = fVar24 + fVar27 * *(float *)((long)pvVar11 + uVar8 * 4);
                  fVar25 = fVar25 + fVar27 * *(float *)((long)pvVar12 + uVar8 * 4);
                  fVar26 = fVar26 + fVar27 * *(float *)((long)pvVar13 + uVar8 * 4);
                  uVar8 = uVar8 + 1;
                } while (uVar19 != uVar8);
                pfVar1 = (float *)((long)local_1b8 + uVar22 * 0x10);
                *pfVar1 = fVar23;
                pfVar1[1] = fVar24;
                pfVar1[2] = fVar25;
                pfVar1[3] = fVar26;
                uVar22 = uVar22 + 1;
                pvVar5 = (void *)((long)pvVar5 + local_60);
                pvVar16 = (void *)((long)pvVar16 + local_60);
                pvVar15 = (void *)((long)pvVar15 + local_60);
                pvVar14 = (void *)((long)pvVar14 + local_60);
                pvVar13 = (void *)((long)pvVar13 + local_68);
                pvVar12 = (void *)((long)pvVar12 + local_68);
                pvVar11 = (void *)((long)pvVar11 + local_68);
                pvVar6 = (void *)((long)pvVar6 + local_68);
                uVar8 = local_f0;
                pvVar18 = local_1b8;
              } while (uVar22 != uVar19);
            }
            if (0 < (int)uVar2) {
              local_38 = (void *)((long)(int)(uVar3 * local_118) * local_b0 + (long)local_a8);
              lVar4 = 0;
              do {
                fVar25 = expf(-*(float *)((long)pvVar18 + lVar4 * 4));
                fVar26 = *(float *)((long)pvVar18 + lVar4 * 4 + 8);
                local_120 = (Mat *)CONCAT44(local_120._4_4_,
                                            *(undefined4 *)((long)pvVar18 + lVar4 * 4 + 0xc));
                if (uVar9 == 0) {
                  local_1b0 = (Mat *)((ulong)local_1b0 & 0xffffffff00000000);
                }
                else {
                  local_108 = ZEXT416((uint)fVar26);
                  fVar26 = expf(-*(float *)((long)pvVar18 + lVar4 * 4 + 4));
                  local_1b0 = (Mat *)CONCAT44(local_1b0._4_4_,1.0 / (fVar26 + 1.0));
                  fVar26 = (float)local_108._0_4_;
                }
                fVar26 = expf(-fVar26);
                local_108._0_4_ = fVar26 + 1.0;
                fVar26 = tanhf(local_120._0_4_);
                pvVar5 = local_70;
                fVar26 = fVar26 / (fVar25 + 1.0) +
                         local_1b0._0_4_ * *(float *)((long)local_70 + lVar4);
                fVar25 = tanhf(fVar26);
                *(float *)((long)pvVar5 + lVar4) = fVar26;
                *(float *)((long)local_78 + lVar4) = fVar25 / (float)local_108._0_4_;
                *(float *)((long)local_38 + lVar4) = fVar25 / (float)local_108._0_4_;
                lVar4 = lVar4 + 4;
              } while (local_80 != lVar4);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != local_110);
          iVar10 = 0;
          piVar21 = local_e8;
        }
      }
      if (piVar21 != (int *)0x0) {
        LOCK();
        *piVar21 = *piVar21 + -1;
        UNLOCK();
        if (*piVar21 == 0) {
          if (local_e0 == (Allocator *)0x0) {
            if (local_1b8 != (void *)0x0) {
              free(local_1b8);
            }
          }
          else {
            (**(code **)(*(long *)local_e0 + 0x18))(local_e0,local_1b8);
          }
        }
      }
    }
    if (uStack_1a0 != (int *)0x0) {
      LOCK();
      *uStack_1a0 = *uStack_1a0 + -1;
      UNLOCK();
      if (*uStack_1a0 == 0) {
        if (local_188 == (Allocator *)0x0) {
          if (local_1a8 != (void *)0x0) {
            free(local_1a8);
          }
        }
        else {
          (**(code **)(*(long *)local_188 + 0x18))();
        }
      }
    }
    uStack_198 = 0;
    uStack_194 = 0;
    uStack_190 = 0;
    local_1a8 = (void *)0x0;
    uStack_1a0._0_4_ = 0;
    uStack_1a0._4_4_ = 0;
    uStack_180 = 0;
    local_178 = 0;
    lStack_170 = 0;
  }
  if (uStack_160 != (int *)0x0) {
    LOCK();
    *uStack_160 = *uStack_160 + -1;
    UNLOCK();
    if (*uStack_160 == 0) {
      if (local_148 == (Allocator *)0x0) {
        if (local_168 != (void *)0x0) {
          free(local_168);
        }
      }
      else {
        (**(code **)(*(long *)local_148 + 0x18))();
      }
    }
  }
  return iVar10;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;

    // internal cell state
    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    hidden.fill(0.f);
    cell.fill(0.f);

    // unroll
    for (int t=0; t<T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c
        int cont = t > 0;

        int ti = reverse ? T-1-t : t;

        const float* x = bottom_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i=0; i<size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i=0; i<num_output; i++)
            {
                float h_cont = cont ? hidden[i] : 0.f;

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = cont ? 1.f / (1.f + exp(-F)) : 0.f;
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell[q] + I * G;
            float H = O * tanh(cell2);
            cell[q] = cell2;
            hidden[q] = H;
            output_data[q] = H;
        }

        // no cell output here
    }

    return 0;
}